

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.hpp
# Opt level: O0

void __thiscall
Tree::addDoubleIndirection
          (Tree *this,vector<record,_std::allocator<record>_> *key,Vertex **root,int weightPos)

{
  short sVar1;
  reference pvVar2;
  ostream *this_00;
  Vertex *this_01;
  reference pvVar3;
  Vertex **local_30;
  Vertex **head_ptr;
  int weightPos_local;
  Vertex **root_local;
  vector<record,_std::allocator<record>_> *key_local;
  Tree *this_local;
  
  local_30 = root;
LAB_0010699b:
  do {
    if (*local_30 == (Vertex *)0x0) {
LAB_00106a5a:
      if (*local_30 == (Vertex *)0x0) {
        this_01 = (Vertex *)operator_new(0x30);
        Vertex::Vertex(this_01);
        *local_30 = this_01;
        std::vector<record,_std::allocator<record>_>::operator=(&(*local_30)->data,key);
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->m_weightArray,(long)weightPos);
        (*local_30)->weight = *pvVar3;
      }
      return;
    }
    pvVar2 = std::vector<record,_std::allocator<record>_>::operator[](key,0);
    sVar1 = pvVar2->year;
    pvVar2 = std::vector<record,_std::allocator<record>_>::operator[](&(*local_30)->data,0);
    if (sVar1 < pvVar2->year) {
      local_30 = &(*local_30)->ptrLeft;
      goto LAB_0010699b;
    }
    pvVar2 = std::vector<record,_std::allocator<record>_>::operator[](key,0);
    sVar1 = pvVar2->year;
    pvVar2 = std::vector<record,_std::allocator<record>_>::operator[](&(*local_30)->data,0);
    if (sVar1 <= pvVar2->year) {
      this_00 = std::operator<<((ostream *)&std::cout,"Element is already in the array");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      goto LAB_00106a5a;
    }
    local_30 = &(*local_30)->ptrRight;
  } while( true );
}

Assistant:

void addDoubleIndirection(vector<record> key, Vertex **root, int weightPos) {
        Vertex **head_ptr = root;
        while (*head_ptr) {
            if (key[0].year < (*head_ptr)->data[0].year) {
                head_ptr = &((*head_ptr)->ptrLeft);
            } else if (key[0].year > (*head_ptr)->data[0].year) {
                head_ptr = &((*head_ptr)->ptrRight);
            } else {
                cout << "Element is already in the array" << endl;
                break;
            }
        }
        if (*head_ptr == nullptr) {
            *head_ptr = new Vertex;
            (*head_ptr)->data = key;
            (*head_ptr)->weight = m_weightArray[weightPos];
        }
    }